

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::ChangeRPath
               (string *file,string *oldRPath,string *newRPath,bool removeEnvironmentRPath,
               string *emsg,bool *changed)

{
  bool bVar1;
  bool *pbVar2;
  ulong uVar3;
  _Optional_payload_base<bool> local_44;
  _Optional_payload_base<bool> local_42;
  optional<bool> result_1;
  bool *pbStack_40;
  optional<bool> result;
  bool *changed_local;
  string *emsg_local;
  bool removeEnvironmentRPath_local;
  string *newRPath_local;
  string *oldRPath_local;
  string *file_local;
  
  pbStack_40 = changed;
  local_42 = (_Optional_payload_base<bool>)
             ChangeRPathELF(file,oldRPath,newRPath,removeEnvironmentRPath,emsg,changed);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_42);
  if (bVar1) {
    pbVar2 = std::optional<bool>::value((optional<bool> *)&local_42);
    file_local._7_1_ = (bool)(*pbVar2 & 1);
  }
  else {
    local_44 = (_Optional_payload_base<bool>)
               ChangeRPathXCOFF(file,oldRPath,newRPath,removeEnvironmentRPath,emsg,pbStack_40);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_44);
    if (bVar1) {
      pbVar2 = std::optional<bool>::value((optional<bool> *)&local_44);
      file_local._7_1_ = (bool)(*pbVar2 & 1);
    }
    else {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        if (emsg != (string *)0x0) {
          std::__cxx11::string::operator=((string *)emsg,"The file format is not recognized.");
        }
        file_local._7_1_ = false;
      }
      else {
        file_local._7_1_ = true;
      }
    }
  }
  return file_local._7_1_;
}

Assistant:

bool cmSystemTools::ChangeRPath(std::string const& file,
                                std::string const& oldRPath,
                                std::string const& newRPath,
                                bool removeEnvironmentRPath, std::string* emsg,
                                bool* changed)
{
  if (cm::optional<bool> result = ChangeRPathELF(
        file, oldRPath, newRPath, removeEnvironmentRPath, emsg, changed)) {
    return result.value();
  }
  if (cm::optional<bool> result = ChangeRPathXCOFF(
        file, oldRPath, newRPath, removeEnvironmentRPath, emsg, changed)) {
    return result.value();
  }
  // The file format is not recognized.  Assume it has no RPATH.
  if (newRPath.empty()) {
    // The caller wanted no RPATH anyway.
    return true;
  }
  if (emsg) {
    *emsg = "The file format is not recognized.";
  }
  return false;
}